

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O3

void png_set_pCAL(png_const_structrp png_ptr,png_inforp info_ptr,png_const_charp purpose,
                 png_int_32 X0,png_int_32 X1,int type,int nparams,png_const_charp units,
                 png_charpp params)

{
  byte *pbVar1;
  undefined4 in_EAX;
  int iVar2;
  size_t sVar3;
  size_t size;
  png_charp pcVar4;
  png_charpp __s;
  ulong uVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  
  auVar7._0_4_ = -(uint)(png_ptr == (png_const_structrp)0x0);
  auVar7._4_4_ = -(uint)(info_ptr == (png_inforp)0x0);
  auVar7._8_4_ = -(uint)(purpose == (png_const_charp)0x0);
  auVar7._12_4_ = -(uint)(units == (png_const_charp)0x0);
  iVar2 = movmskps(in_EAX,auVar7);
  if ((iVar2 != 0) || (0 < nparams && params == (png_charpp)0x0)) {
    return;
  }
  sVar3 = strlen(purpose);
  if ((uint)type < 4) {
    if ((uint)nparams < 0x100) {
      if (nparams != 0) {
        uVar5 = 0;
        do {
          pcVar6 = params[uVar5];
          if (pcVar6 == (char *)0x0) {
LAB_002cdd72:
            pcVar6 = "Invalid format for pCAL parameter";
            goto LAB_002cdd82;
          }
          size = strlen(pcVar6);
          iVar2 = png_check_fp_string(pcVar6,size);
          if (iVar2 == 0) goto LAB_002cdd72;
          uVar5 = uVar5 + 1;
        } while ((uint)nparams != uVar5);
      }
      pcVar4 = (png_charp)png_malloc_warn(png_ptr,sVar3 + 1);
      info_ptr->pcal_purpose = pcVar4;
      if (pcVar4 != (png_charp)0x0) {
        memcpy(pcVar4,purpose,sVar3 + 1);
        info_ptr->pcal_X0 = X0;
        info_ptr->pcal_X1 = X1;
        info_ptr->pcal_type = (png_byte)type;
        info_ptr->pcal_nparams = (png_byte)nparams;
        sVar3 = strlen(units);
        pcVar4 = (png_charp)png_malloc_warn(png_ptr,sVar3 + 1);
        info_ptr->pcal_units = pcVar4;
        if (pcVar4 == (png_charp)0x0) {
          pcVar6 = "Insufficient memory for pCAL units";
        }
        else {
          memcpy(pcVar4,units,sVar3 + 1);
          uVar5 = (ulong)(nparams * 8 + 8);
          __s = (png_charpp)png_malloc_warn(png_ptr,uVar5);
          info_ptr->pcal_params = __s;
          if (__s != (png_charpp)0x0) {
            memset(__s,0,uVar5);
            if (nparams != 0) {
              uVar5 = 0;
              do {
                sVar3 = strlen(params[uVar5]);
                pcVar6 = (char *)png_malloc_warn(png_ptr,sVar3 + 1);
                info_ptr->pcal_params[uVar5] = pcVar6;
                if (info_ptr->pcal_params[uVar5] == (char *)0x0) {
                  pcVar6 = "Insufficient memory for pCAL parameter";
                  goto LAB_002cddb6;
                }
                memcpy(info_ptr->pcal_params[uVar5],params[uVar5],sVar3 + 1);
                uVar5 = uVar5 + 1;
              } while ((uint)nparams != uVar5);
            }
            pbVar1 = (byte *)((long)&info_ptr->valid + 1);
            *pbVar1 = *pbVar1 | 4;
            *(byte *)&info_ptr->free_me = (byte)info_ptr->free_me | 0x80;
            return;
          }
          pcVar6 = "Insufficient memory for pCAL params";
        }
LAB_002cddb6:
        png_warning(png_ptr,pcVar6);
        return;
      }
      pcVar6 = "Insufficient memory for pCAL purpose";
    }
    else {
      pcVar6 = "Invalid pCAL parameter count";
    }
  }
  else {
    pcVar6 = "Invalid pCAL equation type";
  }
LAB_002cdd82:
  png_chunk_report(png_ptr,pcVar6,1);
  return;
}

Assistant:

void PNGAPI
png_set_pCAL(png_const_structrp png_ptr, png_inforp info_ptr,
    png_const_charp purpose, png_int_32 X0, png_int_32 X1, int type,
    int nparams, png_const_charp units, png_charpp params)
{
   png_size_t length;
   int i;

   png_debug1(1, "in %s storage function", "pCAL");

   if (png_ptr == NULL || info_ptr == NULL || purpose == NULL || units == NULL
       || (nparams > 0 && params == NULL))
      return;

   length = strlen(purpose) + 1;
   png_debug1(3, "allocating purpose for info (%lu bytes)",
       (unsigned long)length);

   /* TODO: validate format of calibration name and unit name */

   /* Check that the type matches the specification. */
   if (type < 0 || type > 3)
   {
      png_chunk_report(png_ptr, "Invalid pCAL equation type",
            PNG_CHUNK_WRITE_ERROR);
      return;
   }

   if (nparams < 0 || nparams > 255)
   {
      png_chunk_report(png_ptr, "Invalid pCAL parameter count",
            PNG_CHUNK_WRITE_ERROR);
      return;
   }

   /* Validate params[nparams] */
   for (i=0; i<nparams; ++i)
   {
      if (params[i] == NULL ||
          !png_check_fp_string(params[i], strlen(params[i])))
      {
         png_chunk_report(png_ptr, "Invalid format for pCAL parameter",
               PNG_CHUNK_WRITE_ERROR);
         return;
      }
   }

   info_ptr->pcal_purpose = png_voidcast(png_charp,
       png_malloc_warn(png_ptr, length));

   if (info_ptr->pcal_purpose == NULL)
   {
      png_chunk_report(png_ptr, "Insufficient memory for pCAL purpose",
            PNG_CHUNK_WRITE_ERROR);
      return;
   }

   memcpy(info_ptr->pcal_purpose, purpose, length);

   png_debug(3, "storing X0, X1, type, and nparams in info");
   info_ptr->pcal_X0 = X0;
   info_ptr->pcal_X1 = X1;
   info_ptr->pcal_type = (png_byte)type;
   info_ptr->pcal_nparams = (png_byte)nparams;

   length = strlen(units) + 1;
   png_debug1(3, "allocating units for info (%lu bytes)",
       (unsigned long)length);

   info_ptr->pcal_units = png_voidcast(png_charp,
       png_malloc_warn(png_ptr, length));

   if (info_ptr->pcal_units == NULL)
   {
      png_warning(png_ptr, "Insufficient memory for pCAL units");

      return;
   }

   memcpy(info_ptr->pcal_units, units, length);

   info_ptr->pcal_params = png_voidcast(png_charpp, png_malloc_warn(png_ptr,
       (png_size_t)(((unsigned int)nparams + 1) * (sizeof (png_charp)))));

   if (info_ptr->pcal_params == NULL)
   {
      png_warning(png_ptr, "Insufficient memory for pCAL params");

      return;
   }

   memset(info_ptr->pcal_params, 0, ((unsigned int)nparams + 1) *
       (sizeof (png_charp)));

   for (i = 0; i < nparams; i++)
   {
      length = strlen(params[i]) + 1;
      png_debug2(3, "allocating parameter %d for info (%lu bytes)", i,
          (unsigned long)length);

      info_ptr->pcal_params[i] = (png_charp)png_malloc_warn(png_ptr, length);

      if (info_ptr->pcal_params[i] == NULL)
      {
         png_warning(png_ptr, "Insufficient memory for pCAL parameter");

         return;
      }

      memcpy(info_ptr->pcal_params[i], params[i], length);
   }

   info_ptr->valid |= PNG_INFO_pCAL;
   info_ptr->free_me |= PNG_FREE_PCAL;
}